

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_udunits.cpp
# Opt level: O1

void __thiscall
UDUNITS_derivedAlias_Test::~UDUNITS_derivedAlias_Test(UDUNITS_derivedAlias_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UDUNITS, derivedAlias)
{
    tinyxml2::XMLDocument doc;
    auto err = doc.LoadFile(TEST_FILE_FOLDER "/UDUNITS2/udunits2-derived.xml");
    ASSERT_FALSE(err) << err << std::endl;
    auto cs = doc.FirstChildElement("unit-system")->FirstChildElement("unit");
    int failConvert = 0;
    while (cs != nullptr) {
        auto defEl = cs->FirstChildElement("def");
        // the only one without a definition is the radian since it is
        // dimensionless according to the xml
        std::string def =
            (defEl) ? defEl->FirstChild()->Value() : std::string("rad");

        auto definitionUnit = units::unit_from_string(def);

        auto alias = cs->FirstChildElement("aliases");
        if (alias == nullptr) {
            cs = cs->NextSiblingElement("unit");
            continue;
        }
        auto name = alias->FirstChildElement("name");
        while (name != nullptr) {
            auto sname =
                name->FirstChildElement("singular")->FirstChild()->Value();
            auto nameUnit = units::unit_from_string(sname);
            if (is_error(nameUnit)) {
                std::cout << "unable to convert " << sname
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(nameUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << sname
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            name = name->NextSiblingElement("name");
        }
        // check for symbols
        auto sym = alias->FirstChildElement("symbol");
        while (sym != nullptr) {
            auto symString = sym->FirstChild()->Value();
            auto symUnit = units::unit_from_string(symString);
            if (is_error(symUnit)) {
                std::cout << "unable to convert " << symString
                          << " into a valid unit def=" << def << '\n';
                ++failConvert;
            } else {
                if (convert(unit_cast(symUnit), unit_cast(definitionUnit)) !=
                    1.0) {
                    std::cout << "name and unit do not match " << symString
                              << " and " << def << "\n";
                    ++failConvert;
                }
            }
            sym = sym->NextSiblingElement("symbol");
        }

        cs = cs->NextSiblingElement("unit");
    }
    EXPECT_EQ(failConvert, 0);
}